

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-queue-foreach-delete.c
# Opt level: O1

int run_test_queue_foreach_delete(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  ulong *puVar2;
  uv_idle_t *puVar3;
  uv_prepare_t *handle;
  uv_check_t *handle_00;
  uv_fs_event_t *handle_01;
  long lVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_idle_t *puVar5;
  undefined1 auStack_200 [80];
  int iStack_1b0;
  void *pvStack_1a0;
  char *pcStack_190;
  code *pcStack_40;
  ulong local_38;
  ulong local_30;
  
  puVar3 = idle;
  lVar4 = 0;
  pcStack_40 = (code *)0x1b3cac;
  loop = uv_default_loop();
  do {
    pcStack_40 = (code *)0x1b3cc1;
    iVar1 = uv_idle_init(loop,puVar3);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
LAB_001b40a5:
      pcStack_40 = (code *)0x1b40b2;
      run_test_queue_foreach_delete_cold_1();
      goto LAB_001b40b2;
    }
    pcStack_40 = (code *)0x1b3ceb;
    iVar1 = uv_idle_start(puVar3,*(uv_idle_cb *)((long)idle_cbs + lVar4));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) {
      pcStack_40 = (code *)0x1b40a5;
      run_test_queue_foreach_delete_cold_2();
      goto LAB_001b40a5;
    }
    lVar4 = lVar4 + 8;
    puVar3 = puVar3 + 1;
    local_30 = 0;
  } while (lVar4 != 0x18);
  handle = prepare;
  lVar4 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b3d33;
    iVar1 = uv_prepare_init(loop,handle);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40bf;
    pcStack_40 = (code *)0x1b3d5d;
    iVar1 = uv_prepare_start(handle,*(uv_prepare_cb *)((long)prepare_cbs + lVar4));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40b2;
    lVar4 = lVar4 + 8;
    handle = handle + 1;
  } while (lVar4 != 0x18);
  handle_00 = check;
  lVar4 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b3da5;
    iVar1 = uv_check_init(loop,handle_00);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40d9;
    pcStack_40 = (code *)0x1b3dcf;
    iVar1 = uv_check_start(handle_00,*(uv_check_cb *)((long)check_cbs + lVar4));
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40cc;
    lVar4 = lVar4 + 8;
    handle_00 = handle_00 + 1;
  } while (lVar4 != 0x18);
  handle_01 = fs_event;
  lVar4 = 0;
  do {
    local_30 = 0;
    local_38 = 0;
    pcStack_40 = (code *)0x1b3e1e;
    iVar1 = uv_fs_event_init(loop,handle_01);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40f3;
    pcStack_40 = (code *)0x1b3e4d;
    iVar1 = uv_fs_event_start(handle_01,*(uv_fs_event_cb *)((long)fs_event_cbs + lVar4),".",0);
    local_30 = (ulong)iVar1;
    local_38 = 0;
    if (local_30 != 0) goto LAB_001b40e6;
    lVar4 = lVar4 + 8;
    handle_01 = handle_01 + 1;
  } while (lVar4 != 0x18);
  pcStack_40 = (code *)0x1b3e88;
  iVar1 = uv_timer_init(loop,&timer);
  local_30 = (ulong)iVar1;
  local_38 = 0;
  if (local_30 != 0) goto LAB_001b4100;
  pcStack_40 = (code *)0x1b3ebd;
  iVar1 = uv_timer_start(&timer,helper_timer_cb,0,0);
  local_30 = (ulong)iVar1;
  local_38 = 0;
  if (local_30 != 0) goto LAB_001b410d;
  pcStack_40 = (code *)0x1b3ee8;
  iVar1 = uv_run(loop,UV_RUN_NOWAIT);
  local_30 = 1;
  local_38 = (ulong)iVar1;
  if (local_38 != 1) goto LAB_001b411a;
  local_30 = 1;
  local_38 = (ulong)idle_cb_calls_0;
  if (local_38 != 1) goto LAB_001b4127;
  local_30 = 1;
  local_38 = (ulong)idle_cb_calls_2;
  if (local_38 != 1) goto LAB_001b4141;
  local_30 = 1;
  local_38 = (ulong)prepare_cb_calls_0;
  if (local_38 != 1) goto LAB_001b414e;
  local_30 = 1;
  local_38 = (ulong)prepare_cb_calls_2;
  if (local_38 != 1) goto LAB_001b4168;
  local_30 = 1;
  local_38 = (ulong)check_cb_calls_0;
  if (local_38 != 1) goto LAB_001b4175;
  local_30 = 1;
  local_38 = (ulong)check_cb_calls_2;
  if (local_38 != 1) goto LAB_001b418f;
  local_30 = 1;
  local_38 = (ulong)helper_timer_cb_calls;
  if (local_38 != 1) goto LAB_001b419c;
  pcStack_40 = (code *)0x1b4053;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  pcStack_40 = (code *)0x1b405d;
  uv_run(loop,UV_RUN_DEFAULT);
  local_30 = 0;
  pcStack_40 = (code *)0x1b406e;
  iVar1 = uv_loop_close(loop);
  local_38 = (ulong)iVar1;
  if (local_30 == local_38) {
    pcStack_40 = (code *)0x1b4088;
    uv_library_shutdown();
    return 0;
  }
LAB_001b41a9:
  puVar2 = &local_30;
  pcStack_40 = helper_timer_cb;
  run_test_queue_foreach_delete_cold_22();
  iVar1 = uv_fs_utime((uv_loop_t *)puVar2[1],(uv_fs_t *)(auStack_200 + 8),".",0.0,0.0,(uv_fs_cb)0x0)
  ;
  auStack_200._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_200._0_8_ == (void *)0x0) {
    auStack_200._0_8_ = pvStack_1a0;
    if (pvStack_1a0 != (void *)0x0) goto LAB_001b428f;
    auStack_200._0_8_ = SEXT48(iStack_1b0);
    if ((void *)auStack_200._0_8_ == (void *)0xa) {
      iVar1 = strcmp(pcStack_190,".");
      auStack_200._0_8_ = SEXT48(iVar1);
      if ((void *)auStack_200._0_8_ == (void *)0x0) {
        uv_fs_req_cleanup((uv_fs_t *)(auStack_200 + 8));
        helper_timer_cb_calls = helper_timer_cb_calls + 1;
        return extraout_EAX;
      }
      goto LAB_001b42ad;
    }
  }
  else {
    helper_timer_cb_cold_1();
LAB_001b428f:
    helper_timer_cb_cold_2();
  }
  helper_timer_cb_cold_3();
LAB_001b42ad:
  puVar3 = (uv_idle_t *)auStack_200;
  helper_timer_cb_cold_4();
  if (puVar3 == idle) {
    idle_cb_calls_0 = idle_cb_calls_0 + 1;
    return 0x38c730;
  }
  puVar5 = idle;
  idle0_cb_cold_1();
  if (puVar3 != idle + 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
            ,0x7a,"handle","==","&(idle)[1]",puVar3,"==",0x38c788,loop,puVar5);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-queue-foreach-delete.c"
          ,0x7a,"0 && \"Shouldn\'t be called\" && (&idle[0])");
  abort();
LAB_001b40b2:
  pcStack_40 = (code *)0x1b40bf;
  run_test_queue_foreach_delete_cold_4();
LAB_001b40bf:
  pcStack_40 = (code *)0x1b40cc;
  run_test_queue_foreach_delete_cold_3();
LAB_001b40cc:
  pcStack_40 = (code *)0x1b40d9;
  run_test_queue_foreach_delete_cold_6();
LAB_001b40d9:
  pcStack_40 = (code *)0x1b40e6;
  run_test_queue_foreach_delete_cold_5();
LAB_001b40e6:
  pcStack_40 = (code *)0x1b40f3;
  run_test_queue_foreach_delete_cold_8();
LAB_001b40f3:
  pcStack_40 = (code *)0x1b4100;
  run_test_queue_foreach_delete_cold_7();
LAB_001b4100:
  pcStack_40 = (code *)0x1b410d;
  run_test_queue_foreach_delete_cold_9();
LAB_001b410d:
  pcStack_40 = (code *)0x1b411a;
  run_test_queue_foreach_delete_cold_10();
LAB_001b411a:
  pcStack_40 = (code *)0x1b4127;
  run_test_queue_foreach_delete_cold_11();
LAB_001b4127:
  pcStack_40 = (code *)0x1b4134;
  run_test_queue_foreach_delete_cold_12();
  pcStack_40 = (code *)0x1b4141;
  run_test_queue_foreach_delete_cold_13();
LAB_001b4141:
  pcStack_40 = (code *)0x1b414e;
  run_test_queue_foreach_delete_cold_14();
LAB_001b414e:
  pcStack_40 = (code *)0x1b415b;
  run_test_queue_foreach_delete_cold_15();
  pcStack_40 = (code *)0x1b4168;
  run_test_queue_foreach_delete_cold_16();
LAB_001b4168:
  pcStack_40 = (code *)0x1b4175;
  run_test_queue_foreach_delete_cold_17();
LAB_001b4175:
  pcStack_40 = (code *)0x1b4182;
  run_test_queue_foreach_delete_cold_18();
  pcStack_40 = (code *)0x1b418f;
  run_test_queue_foreach_delete_cold_19();
LAB_001b418f:
  pcStack_40 = (code *)0x1b419c;
  run_test_queue_foreach_delete_cold_20();
LAB_001b419c:
  pcStack_40 = (code *)0x1b41a9;
  run_test_queue_foreach_delete_cold_21();
  goto LAB_001b41a9;
}

Assistant:

TEST_IMPL(queue_foreach_delete) {
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  INIT_AND_START(idle,    loop);
  INIT_AND_START(prepare, loop);
  INIT_AND_START(check,   loop);

#ifdef __linux__
  init_and_start_fs_events(loop);

  /* helper timer to trigger async and fs_event callbacks */
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, helper_timer_cb, 0, 0);
  ASSERT_OK(r);
#endif

  r = uv_run(loop, UV_RUN_NOWAIT);
  ASSERT_EQ(1, r);

  END_ASSERTS(idle);
  END_ASSERTS(prepare);
  END_ASSERTS(check);

#ifdef __linux__
  ASSERT_EQ(1, helper_timer_cb_calls);
#endif

  MAKE_VALGRIND_HAPPY(loop);

  return 0;
}